

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexagons.cpp
# Opt level: O2

void drawHexagons(Mat *image,int factor)

{
  int iVar1;
  uint uVar2;
  uint local_cc;
  Point local_c0;
  Scalar local_b8;
  Mat local_90 [96];
  
  uVar2 = factor * -3;
  local_cc = 0;
  for (iVar1 = factor * -2; iVar1 < 900; iVar1 = iVar1 + factor * 4) {
    for (; (int)uVar2 < 0x5a1; uVar2 = uVar2 + factor * 6) {
      cv::Mat::Mat(local_90,image);
      local_c0.x = uVar2;
      local_c0.y = iVar1;
      cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&local_b8);
      local_b8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] = 255.0;
      local_b8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = 255.0;
      local_b8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 255.0;
      local_b8.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = 0.0;
      drawHexagon(local_90,&local_c0,&local_b8);
      cv::Mat::~Mat(local_90);
    }
    uVar2 = -(local_cc & 1) & factor * 3;
    local_cc = local_cc + 1;
  }
  return;
}

Assistant:

void drawHexagons(Mat image, int factor) {
  // change x, y, factor values to increase/decrease distance between hexagons
  int x = 3;
  int y = 2;
  Point s(-x * factor, -y * factor);

  for(int row = 0; s.y < h; row++) {
    for(int col = 0; s.x <= w; col++) {
      drawHexagon(image, s, Scalar(255, 255, 255));
      s.x += x * factor * 2;
    }
    s.y += y * factor * 2;
    s.x = row % 2 ? x * factor : 0;
  }
}